

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::setLevelSetUniforms
          (VolumeMeshVertexScalarQuantity *this,ShaderProgram *p)

{
  long *in_RSI;
  long in_RDI;
  allocator local_81;
  string local_80 [32];
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  allocator local_31;
  string local_30 [32];
  long *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"u_sliceVector",&local_31);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_50,1,0,0);
  local_58 = local_48;
  local_60 = local_50;
  (**(code **)(*in_RSI + 0x48))(local_50,local_48,in_RSI,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"u_slicePoint",&local_81);
  (**(code **)(*local_10 + 0x28))(*(undefined4 *)(in_RDI + 0x4a0),local_10,local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return;
}

Assistant:

void VolumeMeshVertexScalarQuantity::setLevelSetUniforms(render::ShaderProgram& p) {
  p.setUniform("u_sliceVector", glm::vec3(1, 0, 0));
  p.setUniform("u_slicePoint", levelSetValue);
}